

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph.cpp
# Opt level: O3

optional_ptr<duckdb::QueryGraphEdges::QueryEdge,_true> __thiscall
duckdb::QueryGraphEdges::GetQueryEdge(QueryGraphEdges *this,JoinRelationSet *left)

{
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var1;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_false>
  _Var2;
  ulong uVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_false,_false>,_bool>
  pVar4;
  __uniq_ptr_impl<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
  local_48;
  undefined8 local_40;
  __uniq_ptr_impl<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
  local_38;
  
  if (left->count != 0) {
    uVar3 = 0;
    do {
      _Var2._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->root).children._M_h,
                            (key_type *)
                            (uVar3 * 8 +
                            (long)(left->relations).
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                  .super__Head_base<0UL,_unsigned_long_*,_false>));
      if (_Var2._M_cur == (__node_type *)0x0) {
        _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (left->relations).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_38._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
        .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl =
             (tuple<duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
              )operator_new(0x50);
        *(pointer *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x10) = (pointer)0x0;
        (((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>_>_>
           *)((long)local_38._M_t.
                    super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                    .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl
             + 0x18))->_M_h)._M_buckets = (__buckets_ptr)0x0;
        *(size_type *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x20) = 0;
        ((__node_base *)
        ((long)local_38._M_t.
               super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
               .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
        0x28))->_M_nxt = (_Hash_node_base *)0x0;
        *(size_type *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x30) = 0;
        *(undefined8 *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x38) = 0;
        *(undefined8 *)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
         .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl = 0;
        *(pointer *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl + 8
         ) = (pointer)0x0;
        (((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>_>_>
           *)((long)local_38._M_t.
                    super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                    .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl
             + 0x18))->_M_h)._M_buckets =
             (__node_base_ptr *)
             ((long)local_38._M_t.
                    super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                    .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl
             + 0x48);
        *(size_type *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x20) = 1;
        ((__node_base *)
        ((long)local_38._M_t.
               super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
               .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
        0x28))->_M_nxt = (_Hash_node_base *)0x0;
        *(size_type *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x30) = 0;
        ((_Prime_rehash_policy *)
        ((long)local_38._M_t.
               super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
               .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
        0x38))->_M_max_load_factor = 1.0;
        *(size_t *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x40) = 0;
        *(__node_base_ptr *)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl +
         0x48) = (__node_base_ptr)0x0;
        local_40 = *(undefined8 *)
                    ((long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                    uVar3 * 8);
        local_48._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
        .super__Head_base<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_false>._M_head_impl =
             (tuple<duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
              )(_Tuple_impl<0UL,_duckdb::QueryGraphEdges::QueryEdge_*,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                )0x0;
        pVar4 = ::std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_emplace<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,true>>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&(this->root).children,&local_40);
        _Var2._M_cur = (__node_type *)
                       pVar4.first.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_false>
                       ._M_cur;
        ::std::
        unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
        ::~unique_ptr((unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                       *)&local_38);
        ::std::
        unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
        ::~unique_ptr((unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>_>
                       *)&local_48);
      }
      this = *(QueryGraphEdges **)
              ((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>_>
                      ._M_storage._M_storage + 8);
      uVar3 = uVar3 + 1;
    } while (uVar3 < left->count);
  }
  return (optional_ptr<duckdb::QueryGraphEdges::QueryEdge,_true>)&this->root;
}

Assistant:

optional_ptr<QueryEdge> QueryGraphEdges::GetQueryEdge(JoinRelationSet &left) {
	D_ASSERT(left.count > 0);
	// find the EdgeInfo corresponding to the left set
	optional_ptr<QueryEdge> info(&root);
	for (idx_t i = 0; i < left.count; i++) {
		auto entry = info.get()->children.find(left.relations[i]);
		if (entry == info.get()->children.end()) {
			// node not found, create it
			auto insert_it = info.get()->children.insert(make_pair(left.relations[i], make_uniq<QueryEdge>()));
			entry = insert_it.first;
		}
		// move to the next node
		info = entry->second;
	}
	return info;
}